

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int n;
  int b;
  int a;
  queue<int> q;
  int x;
  int local_54;
  int local_50;
  int local_4c;
  queue<int> local_48;
  int local_24;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105198) = 0;
  local_48.mData = (int *)operator_new__(4);
  *local_48.mData = 0;
  local_48.mCap = 1;
  local_48.mSize = 0;
  local_48.mFront = 0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_54);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&local_4c);
  std::istream::operator>>(piVar1,&local_50);
  if (0 < local_54) {
    iVar5 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_24);
      CP::queue<int>::push(&local_48,&local_24);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_54);
  }
  lVar7 = (long)local_4c;
  lVar8 = (long)local_50;
  if (local_4c < local_50) {
    uVar6 = local_48.mFront + lVar7;
    uVar4 = local_48.mFront + lVar8;
    do {
      lVar8 = lVar8 + -1;
      lVar7 = lVar7 + 1;
      iVar5 = local_48.mData[uVar6 % local_48.mCap];
      local_48.mData[uVar6 % local_48.mCap] = local_48.mData[uVar4 % local_48.mCap];
      local_48.mData[uVar4 % local_48.mCap] = iVar5;
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 - 1;
    } while (lVar7 < lVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size of q = ",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  while (local_48.mSize != 0) {
    piVar3 = CP::queue<int>::front(&local_48);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    CP::queue<int>::pop(&local_48);
  }
  if (local_48.mData != (int *)0x0) {
    operator_delete__(local_48.mData);
  }
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);cin.tie(0);

  int n,a,b;
  CP::queue<int> q;
  cin >> n >> a >> b;
  for (int i = 0;i < n;i++) {
    int x;
    cin >> x;
    q.push(x);
  }
  q.reverse(a,b);

  cout << "size of q = " << q.size() << endl;
  while (!q.empty()) {
    cout << q.front() << " ";
    q.pop();
  }
}